

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O1

void CheckBench(void)

{
  uint uVar1;
  FILE *__stream;
  FString compose;
  FString local_10;
  
  if ((printstats == '\x01') && (ConsoleState == c_up)) {
    if ((waitstart != 0) && (uVar1 = I_MSTime(), uVar1 < waitstart + 5000)) {
      return;
    }
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    local_10.Chars = FString::NullString.Nothing;
    FString::Format(&local_10,
                    "Map %s: \"%s\",\nx = %1.4f, y = %1.4f, z = %1.4f, angle = %1.4f, pitch = %1.4f\n"
                    ,ViewPos.X,ViewPos.Y,ViewPos.Z,ViewAngle.Degrees,ViewPitch.Degrees,
                    level.MapName.Chars,level.LevelName.Chars);
    AppendRenderStats(&local_10);
    AppendRenderTimes(&local_10);
    FString::AppendFormat
              (&local_10,
               "DLight - Walls: %d processed, %d rendered - Flats: %d processed, %d rendered\n",
               (ulong)(uint)iter_dlight,(ulong)(uint)draw_dlight,(ulong)(uint)iter_dlightf,
               (ulong)(uint)draw_dlightf);
    AppendMissingTextureStats(&local_10);
    FString::AppendFormat(&local_10,"%d fps\n\n",(ulong)screen->LastCount);
    __stream = fopen("benchmarks.txt","at");
    if (__stream != (FILE *)0x0) {
      fputs(local_10.Chars,__stream);
      fclose(__stream);
    }
    Printf("Benchmark info saved\n");
    if (switchfps == '\x01') {
      FBaseCVar::SetGenericRep(&vid_fps.super_FBaseCVar,(UCVarValue)0x0,CVAR_Bool);
    }
    printstats = '\0';
    FString::~FString(&local_10);
  }
  return;
}

Assistant:

void CheckBench()
{
	if (printstats && ConsoleState == c_up)
	{
		// if we started the FPS counter ourselves or ran from the console 
		// we need to wait for it to stabilize before using it.
		if (waitstart > 0 && I_MSTime() < waitstart + 5000) return;

		FString compose;

		compose.Format("Map %s: \"%s\",\nx = %1.4f, y = %1.4f, z = %1.4f, angle = %1.4f, pitch = %1.4f\n",
			level.MapName.GetChars(), level.LevelName.GetChars(), ViewPos.X, ViewPos.Y, ViewPos.Z, ViewAngle.Degrees, ViewPitch.Degrees);
		
		AppendRenderStats(compose);
		AppendRenderTimes(compose);
		AppendLightStats(compose);
		AppendMissingTextureStats(compose);
		compose.AppendFormat("%d fps\n\n", screen->GetLastFPS());

		FILE *f = fopen("benchmarks.txt", "at");
		if (f != NULL)
		{
			fputs(compose.GetChars(), f);
			fclose(f);
		}
		Printf("Benchmark info saved\n");
		if (switchfps) vid_fps = false;
		printstats = false;
	}
}